

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O2

_Bool cfg_parse_simple_object(json_value *value,config_item *items)

{
  uint uVar1;
  json_value *value_00;
  int *piVar2;
  json_value *value_01;
  _Bool _Var3;
  ulong uVar4;
  config_item *item;
  void *pvVar5;
  config_item_t *pcVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  int line;
  int iVar11;
  char *pcVar12;
  ulong uVar13;
  bool bVar14;
  ulong uStackY_60;
  
  if (value == (json_value *)0x0) {
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    if (value->type == json_object) {
      uVar4 = (ulong)(uint)(value->u).boolean;
      if ((value->u).boolean < 1) {
        uVar4 = uVar13;
      }
      for (; uVar13 != uVar4; uVar13 = uVar13 + 1) {
        pcVar9 = (value->u).string.ptr;
        pcVar12 = *(char **)(pcVar9 + uVar13 * 0x18);
        item = cfg_find_item(pcVar12,items);
        if (item == (config_item *)0x0) {
          pcVar9 = "Unrecognized attribute: %s";
          iVar11 = 0x1a8;
          goto LAB_001057b1;
        }
        value_00 = *(json_value **)(pcVar9 + uVar13 * 0x18 + 0x10);
        if (value_00 == (json_value *)0x0) {
          pcVar9 = "save_object_value";
          pcVar12 = "NULL pointers passed in!";
          iVar11 = 7;
          line = 0x164;
          goto LAB_00105780;
        }
        _Var3 = is_same_type(value_00,item);
        if (!_Var3) {
          pcVar9 = "save_object_value";
          pcVar12 = "Type mismatch: %s";
          iVar11 = 7;
          line = 0x168;
          goto LAB_00105780;
        }
        switch(value_00->type) {
        case json_object:
          if ((item->subitems != (config_item *)0x0) &&
             (_Var3 = cfg_parse_simple_object(value_00,item->subitems), !_Var3)) goto LAB_00105789;
          break;
        case json_array:
          if (item->list == false) goto LAB_00105789;
          uVar1 = (value_00->u).boolean;
          lVar7 = (long)(int)uVar1;
          if (lVar7 == 0) {
            item->vcount = 0;
            break;
          }
          uStackY_60 = (ulong)item->type;
          switch(item->type) {
          case cdt_bool:
            break;
          case cdt_uint16:
            uStackY_60 = 2;
            break;
          case cdt_int:
            uStackY_60 = 4;
            break;
          case cdt_double:
          case cdt_string:
            uStackY_60 = 8;
            break;
          case cdt_object:
            if (item->subitems_init_cb == (_func_config_item_t_ptr_uint *)0x0) {
              pcVar9 = "save_list_values";
              pcVar12 = "Object array has no init callback associated: %s";
              iVar11 = 3;
              line = 0xfe;
              goto LAB_00105780;
            }
            pcVar6 = (*item->subitems_init_cb)(uVar1);
            if (pcVar6 != (config_item_t *)0x0) {
              item->subitems = pcVar6;
              item->vcount = uVar1;
              uVar8 = 0;
              if (0 < (int)uVar1) {
                uVar8 = (ulong)uVar1;
              }
              uVar10 = 0;
LAB_001056a4:
              if (uVar8 != uVar10) {
                _Var3 = cfg_parse_simple_object
                                  (*(json_value **)((value_00->u).string.ptr + uVar10 * 8),pcVar6);
                if (_Var3) goto code_r0x001056c3;
                _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c"
                           ,0x108,"save_list_values",0,7,"Failed to handle object array: %s",
                           pcVar6->key);
                pcVar6 = item->subitems;
                for (; -1 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
                  cfg_reset_items(pcVar6);
                  pcVar6 = next_items_group(pcVar6);
                }
                if (item->subitems_free_cb != (_func_void_config_item_t_ptr_uint *)0x0) {
                  (*item->subitems_free_cb)(item->subitems,uVar1);
                }
                item->subitems = (config_item_t *)0x0;
                item->vcount = 0;
                goto LAB_00105789;
              }
              goto LAB_0010565f;
            }
            goto LAB_00105789;
          default:
            pcVar9 = "save_list_values";
            pcVar12 = "Config item of type %d is not supported!";
            iVar11 = 3;
            line = 0x12d;
            goto LAB_00105780;
          }
          pvVar5 = malloc(uStackY_60 * lVar7);
          item->value = pvVar5;
          item->_malloc = pvVar5;
          if (pvVar5 == (void *)0x0) {
            pcVar9 = "save_list_values";
            pcVar12 = "Out of memory!";
            iVar11 = 3;
            line = 0x133;
LAB_00105780:
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",
                       line,pcVar9,0,iVar11,pcVar12);
            goto LAB_00105789;
          }
          bVar14 = true;
          uVar8 = 0;
          while (((long)uVar8 < lVar7 && (bVar14))) {
            value_01 = *(json_value **)((value_00->u).string.ptr + uVar8 * 8);
            _Var3 = is_same_type(value_01,item);
            if (!_Var3) goto LAB_001056db;
            switch(item->type) {
            case cdt_bool:
              *(bool *)((long)item->value + uVar8) = (value_01->u).boolean != 0;
              break;
            case cdt_uint16:
              *(undefined2 *)((long)item->value + uVar8 * 2) = *(undefined2 *)&value_01->u;
              break;
            case cdt_int:
              *(int *)((long)item->value + uVar8 * 4) = (value_01->u).boolean;
              break;
            case cdt_double:
              *(int64_t *)((long)item->value + uVar8 * 8) = (value_01->u).integer;
              break;
            case cdt_string:
              pcVar9 = acopy_string((char **)(uVar8 * 8 + (long)item->value),value_01);
              bVar14 = pcVar9 != (char *)0x0;
              goto LAB_00105643;
            default:
              bVar14 = false;
              goto LAB_00105643;
            }
            bVar14 = true;
LAB_00105643:
            uVar8 = uVar8 + 1;
          }
          if (!bVar14) {
LAB_001056db:
            if (item->type == cdt_string) {
              uVar8 = uVar8 & 0xffffffff;
              do {
                free(*(void **)((long)item->value + uVar8 * 8));
                bVar14 = uVar8 != 0;
                uVar8 = uVar8 - 1;
              } while (bVar14);
            }
            free(item->_malloc);
            item->value = (void *)0x0;
            item->_malloc = (void *)0x0;
LAB_00105789:
            pcVar12 = item->key;
            pcVar9 = "Failed to parse attributes in: %s";
            iVar11 = 0x1a3;
LAB_001057b1:
            uVar13 = 0;
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",
                       iVar11,"cfg_parse_simple_object",0,3,pcVar9,pcVar12);
            goto LAB_001057ba;
          }
          item->vcount = uVar1;
          break;
        case json_integer:
          piVar2 = (int *)item->value;
          if (item->type == cdt_uint16) {
            if (piVar2 != (int *)0x0) {
              *(undefined2 *)piVar2 = *(undefined2 *)&value_00->u;
            }
          }
          else if (piVar2 != (int *)0x0) {
            *piVar2 = (value_00->u).boolean;
          }
          break;
        case json_double:
          if ((int64_t *)item->value != (int64_t *)0x0) {
            *(int64_t *)item->value = (value_00->u).integer;
          }
          break;
        case json_string:
          if ((char **)item->value != (char **)0x0) {
            pcVar9 = acopy_string((char **)item->value,value_00);
            item->_malloc = pcVar9;
            if (pcVar9 == (char *)0x0) goto LAB_00105789;
          }
          break;
        case json_boolean:
          if (item->value != (void *)0x0) {
            *(bool *)item->value = (value_00->u).boolean != 0;
          }
          break;
        default:
          pcVar9 = "save_object_value";
          pcVar12 = "Type %d of JSON is not supported!";
          iVar11 = 3;
          line = 0x18c;
          goto LAB_00105780;
        }
LAB_0010565f:
      }
      uVar13 = 1;
    }
  }
LAB_001057ba:
  return SUB81(uVar13,0);
code_r0x001056c3:
  pcVar6 = next_items_group(pcVar6);
  uVar10 = uVar10 + 1;
  goto LAB_001056a4;
}

Assistant:

bool cfg_parse_simple_object(json_value * value, config_item * items)
{
    int i, n;
    config_item * item;
    json_object_entry * obj;
   
    // accept object only
    if (value == NULL || value->type != json_object)
        return false;

    n = value->u.object.length;
    for (i = 0; i < n; i ++) {
        obj = value->u.object.values + i;
        item = cfg_find_item(obj->name, items);
        if (item) {
            if (!save_object_value(obj->value, item)) {
                // Invalid value type
                log_error(LOG_ERR, "Failed to parse attributes in: %s", item->key);
                return false;
            }
        }
        else {
            log_error(LOG_ERR, "Unrecognized attribute: %s", obj->name);
            return false;
        }
    }
    return true;
}